

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O0

void __thiscall
Assimp::ASEImporter::BuildNodes
          (ASEImporter *this,
          vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *nodes)

{
  BaseNode *pBVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  __type _Var4;
  aiNode *paVar5;
  aiNode **ppaVar6;
  aiNode *this_00;
  reference ppBVar7;
  reference ppBVar8;
  size_type sVar9;
  reference ppBVar10;
  ulong uVar11;
  reference ppaVar12;
  DeadlyImportError *this_01;
  aiMatrix4x4t<float> local_14c;
  undefined1 local_10a;
  allocator<char> local_109;
  string local_108;
  uint local_e8;
  uint local_e4;
  uint i_3;
  uint i_2;
  aiNode *pcNode;
  BaseNode *src;
  __normal_iterator<const_Assimp::ASE::BaseNode_**,_std::vector<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>_>
  local_c8;
  iterator i_1;
  undefined1 local_b8 [4];
  uint i;
  vector<aiNode_*,_std::allocator<aiNode_*>_> apcNodes;
  __normal_iterator<Assimp::ASE::BaseNode_*const_*,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
  local_98;
  const_iterator it2;
  iterator iStack_88;
  bool bKnowParent;
  iterator end;
  iterator it;
  vector<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_> aiList;
  aiMatrix4x4 *m;
  BaseNode *node;
  iterator __end1;
  iterator __begin1;
  vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *__range1;
  aiNode *ch;
  aiNode *root;
  vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *nodes_local;
  ASEImporter *this_local;
  
  if (this->pcScene == (aiScene *)0x0) {
    __assert_fail("__null != pcScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/ASE/ASELoader.cpp"
                  ,0x287,"void Assimp::ASEImporter::BuildNodes(std::vector<BaseNode *> &)");
  }
  paVar5 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar5);
  this->pcScene->mRootNode = paVar5;
  aiString::Set((aiString *)paVar5,"<ASERoot>");
  this->pcScene->mRootNode->mNumChildren = 1;
  ppaVar6 = (aiNode **)operator_new__(8);
  this->pcScene->mRootNode->mChildren = ppaVar6;
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  *this->pcScene->mRootNode->mChildren = this_00;
  this_00->mParent = paVar5;
  __end1 = std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>::begin
                     (nodes);
  node = (BaseNode *)
         std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>::end(nodes);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Assimp::ASE::BaseNode_**,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
                                     *)&node), bVar3) {
    ppBVar7 = __gnu_cxx::
              __normal_iterator<Assimp::ASE::BaseNode_**,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
              ::operator*(&__end1);
    aiMatrix4x4t<float>::Transpose(&(*ppBVar7)->mTransform);
    __gnu_cxx::
    __normal_iterator<Assimp::ASE::BaseNode_**,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
    ::operator++(&__end1);
  }
  AddNodes(this,nodes,this_00,(char *)0x0);
  std::vector<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>::vector
            ((vector<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>
              *)&it);
  end = std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>::begin(nodes)
  ;
  iStack_88 = std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>::end
                        (nodes);
  do {
    bVar3 = __gnu_cxx::operator!=(&end,&stack0xffffffffffffff78);
    if (!bVar3) {
      bVar3 = std::
              vector<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>
              ::empty((vector<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>
                       *)&it);
      if (!bVar3) {
        std::vector<aiNode_*,_std::allocator<aiNode_*>_>::vector
                  ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_b8);
        sVar9 = std::
                vector<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>
                ::size((vector<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>
                        *)&it);
        std::vector<aiNode_*,_std::allocator<aiNode_*>_>::reserve
                  ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_b8,
                   sVar9 + this->pcScene->mRootNode->mNumChildren);
        for (i_1._M_current._4_4_ = 0; i_1._M_current._4_4_ < this->pcScene->mRootNode->mNumChildren
            ; i_1._M_current._4_4_ = i_1._M_current._4_4_ + 1) {
          std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                    ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_b8,
                     this->pcScene->mRootNode->mChildren + i_1._M_current._4_4_);
        }
        ppaVar6 = this->pcScene->mRootNode->mChildren;
        if (ppaVar6 != (aiNode **)0x0) {
          operator_delete__(ppaVar6);
        }
        local_c8._M_current =
             (BaseNode **)
             std::
             vector<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>::
             begin((vector<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>
                    *)&it);
        while( true ) {
          src = (BaseNode *)
                std::
                vector<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>
                ::end((vector<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>
                       *)&it);
          bVar3 = __gnu_cxx::operator!=
                            (&local_c8,
                             (__normal_iterator<const_Assimp::ASE::BaseNode_**,_std::vector<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>_>
                              *)&src);
          if (!bVar3) break;
          ppBVar10 = __gnu_cxx::
                     __normal_iterator<const_Assimp::ASE::BaseNode_**,_std::vector<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>_>
                     ::operator*(&local_c8);
          pcNode = (aiNode *)*ppBVar10;
          paVar5 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(paVar5);
          paVar5->mParent = this->pcScene->mRootNode;
          _i_3 = paVar5;
          aiString::Set((aiString *)paVar5,(string *)((pcNode->mName).data + 4));
          AddMeshes(this,(BaseNode *)pcNode,_i_3);
          AddNodes(this,nodes,_i_3,(_i_3->mName).data);
          std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                    ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_b8,(value_type *)&i_3);
          __gnu_cxx::
          __normal_iterator<const_Assimp::ASE::BaseNode_**,_std::vector<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>_>
          ::operator++(&local_c8);
        }
        sVar9 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size
                          ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_b8);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = sVar9;
        uVar11 = SUB168(auVar2 * ZEXT816(8),0);
        if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
          uVar11 = 0xffffffffffffffff;
        }
        ppaVar6 = (aiNode **)operator_new__(uVar11);
        this->pcScene->mRootNode->mChildren = ppaVar6;
        for (local_e4 = 0; uVar11 = (ulong)local_e4,
            sVar9 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size
                              ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_b8),
            uVar11 < sVar9; local_e4 = local_e4 + 1) {
          ppaVar12 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::operator[]
                               ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_b8,
                                (ulong)local_e4);
          this->pcScene->mRootNode->mChildren[local_e4] = *ppaVar12;
        }
        sVar9 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size
                          ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_b8);
        this->pcScene->mRootNode->mNumChildren = (uint)sVar9;
        std::vector<aiNode_*,_std::allocator<aiNode_*>_>::~vector
                  ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_b8);
      }
      for (local_e8 = 0; local_e8 < this->pcScene->mNumMeshes; local_e8 = local_e8 + 1) {
        this->pcScene->mMeshes[local_e8]->mColors[2] = (aiColor4D *)0x0;
      }
      if (this->pcScene->mRootNode->mNumChildren != 0) {
        aiMatrix4x4t<float>::aiMatrix4x4t
                  (&local_14c,1.0,0.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,-1.0,0.0,0.0,0.0,0.0,0.0,1.0);
        memcpy(&this->pcScene->mRootNode->mTransformation,&local_14c,0x40);
        std::vector<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>::
        ~vector((vector<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>
                 *)&it);
        return;
      }
      local_10a = 1;
      this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"ASE: No nodes loaded. The file is either empty or corrupt",
                 &local_109);
      DeadlyImportError::DeadlyImportError(this_01,&local_108);
      local_10a = 0;
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    ppBVar7 = __gnu_cxx::
              __normal_iterator<Assimp::ASE::BaseNode_**,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
              ::operator*(&end);
    if (((*ppBVar7)->mProcessed & 1U) == 0) {
      it2._M_current._7_1_ = 0;
      apcNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>::
                    begin(nodes);
      __gnu_cxx::
      __normal_iterator<Assimp::ASE::BaseNode*const*,std::vector<Assimp::ASE::BaseNode*,std::allocator<Assimp::ASE::BaseNode*>>>
      ::__normal_iterator<Assimp::ASE::BaseNode**>
                ((__normal_iterator<Assimp::ASE::BaseNode*const*,std::vector<Assimp::ASE::BaseNode*,std::allocator<Assimp::ASE::BaseNode*>>>
                  *)&local_98,
                 (__normal_iterator<Assimp::ASE::BaseNode_**,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
                  *)&apcNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
      while (bVar3 = __gnu_cxx::operator!=(&local_98,&stack0xffffffffffffff78), bVar3) {
        bVar3 = __gnu_cxx::operator==(&local_98,&end);
        if (!bVar3) {
          ppBVar8 = __gnu_cxx::
                    __normal_iterator<Assimp::ASE::BaseNode_*const_*,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
                    ::operator*(&local_98);
          pBVar1 = *ppBVar8;
          ppBVar7 = __gnu_cxx::
                    __normal_iterator<Assimp::ASE::BaseNode_**,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
                    ::operator*(&end);
          _Var4 = std::operator==(&pBVar1->mName,&(*ppBVar7)->mParent);
          if (_Var4) {
            it2._M_current._7_1_ = 1;
            break;
          }
        }
        __gnu_cxx::
        __normal_iterator<Assimp::ASE::BaseNode_*const_*,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
        ::operator++(&local_98);
      }
      if ((it2._M_current._7_1_ & 1) == 0) {
        ppBVar7 = __gnu_cxx::
                  __normal_iterator<Assimp::ASE::BaseNode_**,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
                  ::operator*(&end);
        std::vector<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>::
        push_back((vector<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>
                   *)&it,ppBVar7);
      }
    }
    __gnu_cxx::
    __normal_iterator<Assimp::ASE::BaseNode_**,_std::vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>_>
    ::operator++(&end);
  } while( true );
}

Assistant:

void ASEImporter::BuildNodes(std::vector<BaseNode*>& nodes) {
    ai_assert(NULL != pcScene);

    // allocate the one and only root node
    aiNode* root = pcScene->mRootNode = new aiNode();
    root->mName.Set("<ASERoot>");

    // Setup the coordinate system transformation
    pcScene->mRootNode->mNumChildren = 1;
    pcScene->mRootNode->mChildren = new aiNode*[1];
    aiNode* ch = pcScene->mRootNode->mChildren[0] = new aiNode();
    ch->mParent = root;

    // Change the transformation matrix of all nodes
    for (BaseNode *node : nodes) {
        aiMatrix4x4& m = node->mTransform;
        m.Transpose(); // row-order vs column-order
    }

    // add all nodes
    AddNodes(nodes,ch,NULL);

    // now iterate through al nodes and find those that have not yet
    // been added to the nodegraph (= their parent could not be recognized)
    std::vector<const BaseNode*> aiList;
    for (std::vector<BaseNode*>::iterator it = nodes.begin(), end = nodes.end();it != end; ++it)    {
        if ((*it)->mProcessed) {
            continue;
        }

        // check whether our parent is known
        bool bKnowParent = false;

        // search the list another time, starting *here* and try to find out whether
        // there is a node that references *us* as a parent
        for (std::vector<BaseNode*>::const_iterator it2 = nodes.begin();it2 != end; ++it2) {
            if (it2 == it) {
                continue;
            }

            if ((*it2)->mName == (*it)->mParent)    {
                bKnowParent = true;
                break;
            }
        }
        if (!bKnowParent)   {
            aiList.push_back(*it);
        }
    }

    // Are there ane orphaned nodes?
    if (!aiList.empty())    {
        std::vector<aiNode*> apcNodes;
        apcNodes.reserve(aiList.size() + pcScene->mRootNode->mNumChildren);

        for (unsigned int i = 0; i < pcScene->mRootNode->mNumChildren;++i)
            apcNodes.push_back(pcScene->mRootNode->mChildren[i]);

        delete[] pcScene->mRootNode->mChildren;
        for (std::vector<const BaseNode*>::/*const_*/iterator i =  aiList.begin();i != aiList.end();++i)    {
            const ASE::BaseNode* src = *i;

            // The parent is not known, so we can assume that we must add
            // this node to the root node of the whole scene
            aiNode* pcNode = new aiNode();
            pcNode->mParent = pcScene->mRootNode;
            pcNode->mName.Set(src->mName);
            AddMeshes(src,pcNode);
            AddNodes(nodes,pcNode,pcNode->mName.data);
            apcNodes.push_back(pcNode);
        }

        // Regenerate our output array
        pcScene->mRootNode->mChildren = new aiNode*[apcNodes.size()];
        for (unsigned int i = 0; i < apcNodes.size();++i)
            pcScene->mRootNode->mChildren[i] = apcNodes[i];

        pcScene->mRootNode->mNumChildren = (unsigned int)apcNodes.size();
    }

    // Reset the third color set to NULL - we used this field to store a temporary pointer
    for (unsigned int i = 0; i < pcScene->mNumMeshes;++i)
        pcScene->mMeshes[i]->mColors[2] = NULL;

    // The root node should not have at least one child or the file is valid
    if (!pcScene->mRootNode->mNumChildren) {
        throw DeadlyImportError("ASE: No nodes loaded. The file is either empty or corrupt");
    }

    // Now rotate the whole scene 90 degrees around the x axis to convert to internal coordinate system
    pcScene->mRootNode->mTransformation = aiMatrix4x4(1.f,0.f,0.f,0.f,
        0.f,0.f,1.f,0.f,0.f,-1.f,0.f,0.f,0.f,0.f,0.f,1.f);
}